

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  float fVar1;
  ImVec2 p_min;
  bool bVar2;
  ImGuiWindowTempData *min;
  ImGuiWindow *r_outer_00;
  uint in_EDX;
  ImVec2 *in_RSI;
  float fVar3;
  ImVec2 IVar4;
  ImRect IVar5;
  bool ret;
  ImGuiWindowFlags window_flags;
  ImVec2 pos;
  ImRect r_outer;
  ImVec2 size_expected;
  ImGuiWindow *popup_window;
  char name [16];
  int popup_max_height_in_items;
  ImU32 frame_col;
  ImRect value_bb;
  bool popup_open;
  bool pressed;
  bool held;
  bool hovered;
  ImRect total_bb;
  ImRect frame_bb;
  float w;
  ImVec2 label_size;
  float arrow_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiCond backup_next_window_size_constraint;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_000004a4;
  bool *in_stack_000004a8;
  char *in_stack_000004b0;
  ImRect *in_stack_fffffffffffffdf8;
  ImRect *in_stack_fffffffffffffe00;
  ImGuiWindow *in_stack_fffffffffffffe08;
  ImVec2 *in_stack_fffffffffffffe10;
  int count;
  ImDrawList *in_stack_fffffffffffffe18;
  ImGuiWindow *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  ImDrawList *in_stack_fffffffffffffe30;
  ImGuiStyleVar idx;
  ImRect *in_stack_fffffffffffffe38;
  undefined1 hide_text_after_hash;
  char *text;
  ImVec2 *this;
  ImVec2 pos_00;
  float in_stack_fffffffffffffe60;
  float local_178;
  float local_174;
  ImVec2 local_16c;
  undefined4 local_164;
  ImVec2 local_160;
  undefined8 in_stack_fffffffffffffea8;
  ImVec2 in_stack_fffffffffffffeb0;
  ImGuiDir *in_stack_fffffffffffffed8;
  ImVec2 *in_stack_fffffffffffffee0;
  ImVec2 *in_stack_fffffffffffffee8;
  ImVec2 local_10c;
  int local_104;
  ImVec2 local_100;
  float in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff0c;
  ImVec2 in_stack_ffffffffffffff10;
  ImVec2 local_d4;
  ImVec2 local_cc;
  ImVec2 local_c4;
  ImU32 local_bc;
  ImVec2 local_b8;
  ImVec2 local_b0;
  undefined1 local_a8 [16];
  byte local_98;
  byte local_97;
  undefined1 local_95;
  undefined1 local_94 [8];
  ImVec2 local_8c;
  ImRect local_84;
  ImVec2 local_74;
  ImVec2 local_6c;
  undefined1 local_64 [12];
  float fStack_58;
  float local_54;
  ImVec2 local_50;
  float local_48;
  ImGuiID local_44;
  ImGuiStyle *local_40;
  ImGuiWindow *local_38;
  ImGuiCond local_2c;
  ImGuiContext *local_28;
  uint local_1c;
  ImVec2 *local_18;
  bool local_1;
  
  local_28 = GImGui;
  local_2c = (GImGui->NextWindowData).SizeConstraintCond;
  (GImGui->NextWindowData).SizeConstraintCond = 0;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_38 = GetCurrentWindow();
  if ((local_38->SkipItems & 1U) == 0) {
    local_40 = &local_28->Style;
    local_44 = ImGuiWindow::GetID(in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
                                  (char *)in_stack_fffffffffffffe10);
    if ((local_1c & 0x20) == 0) {
      local_174 = GetFrameHeight();
    }
    else {
      local_174 = 0.0;
    }
    local_48 = local_174;
    local_50 = CalcTextSize((char *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                            (char *)in_stack_fffffffffffffe20,
                            SUB81((ulong)in_stack_fffffffffffffe18 >> 0x38,0),
                            SUB84(in_stack_fffffffffffffe18,0));
    if ((local_1c & 0x40) == 0) {
      local_178 = CalcItemWidth();
    }
    else {
      local_178 = local_48;
    }
    local_54 = local_178;
    min = &local_38->DC;
    fVar3 = (local_40->FramePadding).y;
    ImVec2::ImVec2(&local_74,local_178,fVar3 + fVar3 + local_50.y);
    local_6c = operator+(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x17fa2a);
    ImRect::ImRect((ImRect *)local_64,&min->CursorPos,&local_6c);
    if (local_50.x <= 0.0) {
      fVar3 = 0.0;
    }
    else {
      fVar3 = (local_40->ItemInnerSpacing).x + local_50.x;
    }
    IVar4 = (ImVec2)local_94;
    ImVec2::ImVec2((ImVec2 *)IVar4,fVar3,0.0);
    local_8c = operator+(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x17fad8);
    ImRect::ImRect(&local_84,(ImVec2 *)local_64,&local_8c);
    ItemSize(in_stack_fffffffffffffe00,(float)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
    bVar2 = ItemAdd((ImRect *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                    (ImGuiID)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                    (ImRect *)in_stack_fffffffffffffe18);
    if (bVar2) {
      pos_00 = (ImVec2)local_64;
      local_97 = ButtonBehavior(in_stack_fffffffffffffe38,
                                (ImGuiID)((ulong)in_stack_fffffffffffffe30 >> 0x20),
                                (bool *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28
                                                ),(bool *)in_stack_fffffffffffffe20,
                                (ImGuiButtonFlags)((ulong)in_stack_fffffffffffffe18 >> 0x20));
      local_98 = IsPopupOpen((ImGuiID)((ulong)in_stack_fffffffffffffe00 >> 0x20));
      text = local_64 + 8;
      this = &local_b8;
      ImVec2::ImVec2(this,local_48,0.0);
      local_b0 = operator-(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x17fbc5);
      ImRect::ImRect((ImRect *)local_a8,(ImVec2 *)pos_00,&local_b0);
      local_bc = GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                             SUB84(in_stack_fffffffffffffe10,0));
      RenderNavHighlight((ImRect *)in_stack_fffffffffffffeb0,
                         (ImGuiID)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                         (ImGuiNavHighlightFlags)in_stack_fffffffffffffea8);
      if ((local_1c & 0x40) == 0) {
        in_stack_fffffffffffffe30 = local_38->DrawList;
        in_stack_fffffffffffffe38 = (ImRect *)local_64;
        ImVec2::ImVec2(&local_c4,(float)local_64._8_4_ - local_48,fStack_58);
        ImDrawList::AddRectFilled
                  ((ImDrawList *)in_stack_fffffffffffffe20,(ImVec2 *)in_stack_fffffffffffffe18,
                   in_stack_fffffffffffffe10,(ImU32)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                   SUB84(in_stack_fffffffffffffe08,0),
                   (int)((ulong)in_stack_fffffffffffffe00 >> 0x20));
      }
      if ((local_1c & 0x20) == 0) {
        in_stack_fffffffffffffe18 = local_38->DrawList;
        ImVec2::ImVec2(&local_cc,(float)local_64._8_4_ - local_48,(float)local_64._4_4_);
        in_stack_fffffffffffffe20 = (ImGuiWindow *)(local_64 + 8);
        in_stack_fffffffffffffe2f = 1;
        if ((local_98 & 1) == 0) {
          in_stack_fffffffffffffe2f = local_95;
        }
        GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                    SUB84(in_stack_fffffffffffffe10,0));
        ImDrawList::AddRectFilled
                  ((ImDrawList *)in_stack_fffffffffffffe20,(ImVec2 *)in_stack_fffffffffffffe18,
                   in_stack_fffffffffffffe10,(ImU32)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                   SUB84(in_stack_fffffffffffffe08,0),
                   (int)((ulong)in_stack_fffffffffffffe00 >> 0x20));
        fVar1 = (local_40->FramePadding).y;
        ImVec2::ImVec2(&local_d4,((float)local_64._8_4_ - local_48) + fVar1,
                       (float)local_64._4_4_ + fVar1);
        RenderArrow(in_stack_ffffffffffffff10,(ImGuiDir)in_stack_ffffffffffffff0c,
                    in_stack_ffffffffffffff08);
      }
      p_min.y = fVar3;
      p_min.x = in_stack_fffffffffffffe60;
      RenderFrameBorder(p_min,IVar4,pos_00.y);
      if ((local_18 != (ImVec2 *)0x0) && ((local_1c & 0x40) == 0)) {
        operator+(&in_stack_fffffffffffffdf8->Min,(ImVec2 *)0x17fe6d);
        in_stack_fffffffffffffe08 = (ImGuiWindow *)(local_a8 + 8);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff08,0.0,0.0);
        in_stack_fffffffffffffdf8 = (ImRect *)0x0;
        RenderTextClipped((ImVec2 *)pos_00,this,text,(char *)in_stack_fffffffffffffe38,
                          (ImVec2 *)in_stack_fffffffffffffe30,
                          (ImVec2 *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
                          (ImRect *)CONCAT44(fVar3,in_stack_fffffffffffffe60));
        in_stack_fffffffffffffe10 = local_18;
      }
      idx = (ImGuiStyleVar)((ulong)in_stack_fffffffffffffe30 >> 0x20);
      hide_text_after_hash = (undefined1)((ulong)in_stack_fffffffffffffe38 >> 0x38);
      if (0.0 < local_50.x) {
        ImVec2::ImVec2(&local_100,(float)local_64._8_4_ + (local_40->ItemInnerSpacing).x,
                       (float)local_64._4_4_ + (local_40->FramePadding).y);
        RenderText(pos_00,(char *)this,text,(bool)hide_text_after_hash);
      }
      if ((((local_97 & 1) != 0) || (local_28->NavActivateId == local_44)) && ((local_98 & 1) == 0))
      {
        if ((local_38->DC).NavLayerCurrent == ImGuiNavLayer_Main) {
          local_38->NavLastIds[0] = local_44;
        }
        OpenPopupEx((ImGuiID)pos_00.y);
        local_98 = 1;
      }
      if ((local_98 & 1) == 0) {
        local_1 = false;
      }
      else {
        if (local_2c == 0) {
          if ((local_1c & 0x1e) == 0) {
            local_1c = local_1c | 4;
          }
          local_104 = -1;
          if ((local_1c & 4) == 0) {
            if ((local_1c & 2) == 0) {
              if ((local_1c & 8) != 0) {
                local_104 = 0x14;
              }
            }
            else {
              local_104 = 4;
            }
          }
          else {
            local_104 = 8;
          }
          ImVec2::ImVec2(&local_10c,local_54,0.0);
          fVar3 = CalcMaxPopupHeightFromItemCount(local_104);
          ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffeec,3.4028235e+38,fVar3);
          SetNextWindowSizeConstraints
                    ((ImVec2 *)in_stack_fffffffffffffe20,(ImVec2 *)in_stack_fffffffffffffe18,
                     (ImGuiSizeCallback)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
          count = (int)((ulong)in_stack_fffffffffffffe10 >> 0x20);
        }
        else {
          (local_28->NextWindowData).SizeConstraintCond = local_2c;
          fVar3 = ImMax<float>((local_28->NextWindowData).SizeConstraintRect.Min.x,local_54);
          count = (int)((ulong)in_stack_fffffffffffffe10 >> 0x20);
          (local_28->NextWindowData).SizeConstraintRect.Min.x = fVar3;
        }
        ImFormatString(&stack0xfffffffffffffed8,0x10,"##Combo_%02d",
                       (ulong)(uint)(local_28->BeginPopupStack).Size);
        r_outer_00 = FindWindowByName((char *)in_stack_fffffffffffffe00);
        if ((r_outer_00 != (ImGuiWindow *)0x0) && ((r_outer_00->WasActive & 1U) != 0)) {
          IVar4 = CalcWindowExpectedSize(in_stack_fffffffffffffe08);
          if ((local_1c & 1) != 0) {
            r_outer_00->AutoPosLastDirection = 0;
          }
          IVar5 = GetWindowAllowedExtentRect(in_stack_fffffffffffffe20);
          fVar3 = IVar5.Max.y;
          ImRect::GetBL(in_stack_fffffffffffffdf8);
          FindBestWindowPosForPopupEx
                    (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                     (ImRect *)r_outer_00,(ImRect *)IVar4,(ImGuiPopupPositionPolicy)fVar3);
          ImVec2::ImVec2(&local_160,0.0,0.0);
          SetNextWindowPos((ImVec2 *)&stack0xfffffffffffffeb0,0,&local_160);
        }
        local_164 = 0x4000143;
        ImVec2::ImVec2(&local_16c,(local_40->FramePadding).x,(local_40->WindowPadding).y);
        PushStyleVar(idx,(ImVec2 *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
        bVar2 = Begin(in_stack_000004b0,in_stack_000004a8,in_stack_000004a4);
        PopStyleVar(count);
        if (bVar2) {
          local_1 = true;
        }
        else {
          EndPopup();
          local_1 = false;
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    // Always consume the SetNextWindowSizeConstraint() call in our early return paths
    ImGuiContext& g = *GImGui;
    ImGuiCond backup_next_window_size_constraint = g.NextWindowData.SizeConstraintCond;
    g.NextWindowData.SizeConstraintCond = 0;

    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : CalcItemWidth();
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y*2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(frame_bb, id, &hovered, &held);
    bool popup_open = IsPopupOpen(id);

    const ImRect value_bb(frame_bb.Min, frame_bb.Max - ImVec2(arrow_size, 0.0f));
    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(frame_bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(frame_bb.Min, ImVec2(frame_bb.Max.x - arrow_size, frame_bb.Max.y), frame_col, style.FrameRounding, ImDrawCornerFlags_Left);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        window->DrawList->AddRectFilled(ImVec2(frame_bb.Max.x - arrow_size, frame_bb.Min.y), frame_bb.Max, GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button), style.FrameRounding, (w <= arrow_size) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Right);
        RenderArrow(ImVec2(frame_bb.Max.x - arrow_size + style.FramePadding.y, frame_bb.Min.y + style.FramePadding.y), ImGuiDir_Down);
    }
    RenderFrameBorder(frame_bb.Min, frame_bb.Max, style.FrameRounding);
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
        RenderTextClipped(frame_bb.Min + style.FramePadding, value_bb.Max, preview_value, NULL, NULL, ImVec2(0.0f,0.0f));
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        if (window->DC.NavLayerCurrent == 0)
            window->NavLastIds[0] = id;
        OpenPopupEx(id);
        popup_open = true;
    }

    if (!popup_open)
        return false;

    if (backup_next_window_size_constraint)
    {
        g.NextWindowData.SizeConstraintCond = backup_next_window_size_constraint;
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_));    // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth

    // Peak into expected window size so we can position it
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            ImVec2 size_expected = CalcWindowExpectedSize(popup_window);
            if (flags & ImGuiComboFlags_PopupAlignLeft)
                popup_window->AutoPosLastDirection = ImGuiDir_Left;
            ImRect r_outer = GetWindowAllowedExtentRect(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(frame_bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, frame_bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // Horizontally align ourselves with the framed text
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings;
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(style.FramePadding.x, style.WindowPadding.y));
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}